

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptm_mgau.c
# Opt level: O1

int32 read_mixw(s2_semi_mgau_t *s,char *file_name,double SmoothMin)

{
  uint8 uVar1;
  int32 iVar2;
  int iVar3;
  FILE *pFVar4;
  uint8 ***pppuVar5;
  float32 *vec;
  size_t sVar6;
  char *pcVar7;
  bool bVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  float64 fVar13;
  int32 n_comp;
  int32 byteswap;
  int32 n_sen;
  uint32 chksum;
  int32 n_feat;
  char eofchk;
  char **argval;
  char **argname;
  int32 n;
  undefined8 in_stack_ffffffffffffff68;
  undefined4 uVar14;
  int local_80;
  char local_79;
  int32 local_78;
  uint local_74;
  uint32 local_70;
  uint local_6c;
  char *local_68;
  int local_60;
  undefined1 local_59;
  char **local_58;
  char **local_50;
  int local_44;
  FILE *local_40;
  double local_38;
  
  local_38 = SmoothMin;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
          ,0x44c,"Reading mixture weights file \'%s\'\n",file_name);
  local_68 = file_name;
  pFVar4 = fopen(file_name,"rb");
  if (pFVar4 == (FILE *)0x0) {
    err_msg_system(ERR_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                   ,0x44f,"Failed to open mixture weights file \'%s\' for reading",local_68);
    goto LAB_00140f7d;
  }
  local_40 = pFVar4;
  iVar2 = bio_readhdr((FILE *)pFVar4,&local_50,&local_58,&local_78);
  if (iVar2 < 0) {
    pcVar7 = "Failed to read header from file \'%s\'\n";
    lVar9 = 0x453;
  }
  else {
    pcVar7 = *local_50;
    if (pcVar7 == (char *)0x0) {
      bVar8 = true;
      uVar11 = 0;
    }
    else {
      uVar11 = 0;
      bVar8 = false;
      do {
        iVar3 = strcmp(pcVar7,"version");
        if (iVar3 == 0) {
          pcVar7 = local_58[uVar11];
          iVar3 = strcmp(pcVar7,"1.0");
          if (iVar3 != 0) {
            in_stack_ffffffffffffff68 = 0;
            err_msg(ERR_WARN,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                    ,0x45b,"Version mismatch(%s): %s, expecting %s\n",local_68,pcVar7,"1.0");
          }
        }
        else {
          iVar3 = strcmp(pcVar7,"chksum0");
          if (iVar3 == 0) {
            bVar8 = true;
          }
        }
        pcVar7 = local_50[uVar11 + 1];
        uVar11 = uVar11 + 1;
      } while (pcVar7 != (char *)0x0);
      bVar8 = !bVar8;
    }
    bio_hdrarg_free(local_50,local_58);
    pFVar4 = local_40;
    local_58 = (char **)0x0;
    local_50 = (char **)0x0;
    local_70 = 0;
    iVar2 = bio_fread(&local_74,4,1,(FILE *)local_40,local_78,&local_70);
    if ((((iVar2 == 1) &&
         (iVar2 = bio_fread(&local_6c,4,1,(FILE *)pFVar4,local_78,&local_70), iVar2 == 1)) &&
        (iVar2 = bio_fread(&local_80,4,1,(FILE *)pFVar4,local_78,&local_70), iVar2 == 1)) &&
       (iVar2 = bio_fread(&local_44,4,1,(FILE *)pFVar4,local_78,&local_70), iVar2 == 1)) {
      if (local_6c != s->g->n_feat) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                ,0x470,"#Features streams(%d) != %d\n");
        goto LAB_00140f7d;
      }
      if (local_44 != local_74 * local_6c * local_80) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                ,0x474,"%s: #float32s(%d) doesn\'t match header dimensions: %d x %d x %d\n",local_68
                ,uVar11 & 0xffffffff,
                CONCAT44((int)((ulong)in_stack_ffffffffffffff68 >> 0x20),local_74),local_6c,local_80
               );
        goto LAB_00140f7d;
      }
      s->n_sen = local_74;
      local_79 = bVar8;
      pppuVar5 = (uint8 ***)
                 __ckd_calloc_3d__((long)(int)local_6c,(long)s->g->n_density,(long)(int)local_74,1,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                                   ,0x47d);
      s->mixw = pppuVar5;
      vec = (float32 *)
            __ckd_calloc__((long)local_80,4,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                           ,0x480);
      uVar14 = (undefined4)((ulong)in_stack_ffffffffffffff68 >> 0x20);
      if ((int)local_74 < 1) {
        local_60 = 0;
      }
      else {
        lVar9 = 0;
        local_60 = 0;
        do {
          if (0 < (int)local_6c) {
            lVar12 = 0;
            do {
              iVar2 = bio_fread(vec,4,local_80,(FILE *)pFVar4,local_78,&local_70);
              if (iVar2 != local_80) {
                pcVar7 = "bio_fread(%s) (arraydata) failed\n";
                lVar9 = 0x488;
                goto LAB_00140f6c;
              }
              fVar13 = vector_sum_norm(vec,local_80);
              local_60 = (local_60 + 1) - (uint)(0.0 < (double)fVar13);
              vector_floor(vec,local_80,(float64)local_38);
              vector_sum_norm(vec,local_80);
              if (0 < local_80) {
                lVar10 = 0;
                do {
                  iVar3 = logmath_log(s->lmath_8b,(float64)(double)(float)vec[lVar10]);
                  uVar1 = -(char)iVar3;
                  if (iVar3 - 1U < 0xffffff60) {
                    uVar1 = 0x9f;
                  }
                  s->mixw[lVar12][lVar10][lVar9] = uVar1;
                  lVar10 = lVar10 + 1;
                } while (lVar10 < local_80);
              }
              lVar12 = lVar12 + 1;
              pFVar4 = local_40;
            } while (lVar12 < (int)local_6c);
          }
          uVar14 = (undefined4)((ulong)in_stack_ffffffffffffff68 >> 0x20);
          lVar9 = lVar9 + 1;
        } while (lVar9 < (int)local_74);
      }
      if (0 < local_60) {
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                ,0x49d,"Weight normalization failed for %d mixture weights components\n");
      }
      ckd_free(vec);
      if (local_79 == '\0') {
        bio_verify_chksum((FILE *)pFVar4,local_78,local_70);
      }
      sVar6 = fread(&local_59,1,1,pFVar4);
      if (sVar6 != 1) {
        fclose(pFVar4);
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                ,0x4a9,"Read %d x %d x %d mixture weights\n",(ulong)local_74,(ulong)local_6c,
                CONCAT44(uVar14,local_80));
        return local_74;
      }
      pcVar7 = "More data than expected in %s\n";
      lVar9 = 0x4a5;
    }
    else {
      pcVar7 = "bio_fread(%s) (arraysize) failed\n";
      lVar9 = 0x46d;
    }
  }
LAB_00140f6c:
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
          ,lVar9,pcVar7,local_68);
LAB_00140f7d:
  exit(1);
}

Assistant:

static int32
read_mixw(ptm_mgau_t * s, char const *file_name, double SmoothMin)
{
    char **argname, **argval;
    char eofchk;
    FILE *fp;
    int32 byteswap, chksum_present;
    uint32 chksum;
    float32 *pdf;
    int32 i, f, c, n;
    int32 n_sen;
    int32 n_feat;
    int32 n_comp;
    int32 n_err;

    E_INFO("Reading mixture weights file '%s'\n", file_name);

    if ((fp = fopen(file_name, "rb")) == NULL)
        E_FATAL_SYSTEM("Failed to open mixture file '%s' for reading", file_name);

    /* Read header, including argument-value info and 32-bit byteorder magic */
    if (bio_readhdr(fp, &argname, &argval, &byteswap) < 0)
        E_FATAL("Failed to read header from '%s'\n", file_name);

    /* Parse argument-value list */
    chksum_present = 0;
    for (i = 0; argname[i]; i++) {
        if (strcmp(argname[i], "version") == 0) {
            if (strcmp(argval[i], MGAU_MIXW_VERSION) != 0)
                E_WARN("Version mismatch(%s): %s, expecting %s\n",
                       file_name, argval[i], MGAU_MIXW_VERSION);
        }
        else if (strcmp(argname[i], "chksum0") == 0) {
            chksum_present = 1; /* Ignore the associated value */
        }
    }
    bio_hdrarg_free(argname, argval);
    argname = argval = NULL;

    chksum = 0;

    /* Read #senones, #features, #codewords, arraysize */
    if ((bio_fread(&n_sen, sizeof(int32), 1, fp, byteswap, &chksum) != 1)
        || (bio_fread(&n_feat, sizeof(int32), 1, fp, byteswap, &chksum) !=
            1)
        || (bio_fread(&n_comp, sizeof(int32), 1, fp, byteswap, &chksum) !=
            1)
        || (bio_fread(&n, sizeof(int32), 1, fp, byteswap, &chksum) != 1)) {
        E_FATAL("bio_fread(%s) (arraysize) failed\n", file_name);
    }
    if (n_feat != s->g->n_feat)
        E_FATAL("#Features streams(%d) != %d\n", n_feat, s->g->n_feat);
    if (n != n_sen * n_feat * n_comp) {
        E_FATAL
            ("%s: #float32s(%d) doesn't match header dimensions: %d x %d x %d\n",
             file_name, i, n_sen, n_feat, n_comp);
    }

    /* n_sen = number of mixture weights per codeword, which is
     * fixed at the number of senones since we have only one codebook.
     */
    s->n_sen = n_sen;

    /* Quantized mixture weight arrays. */
    s->mixw = ckd_calloc_3d(s->g->n_feat, s->g->n_density,
                            n_sen, sizeof(***s->mixw));

    /* Temporary structure to read in floats before conversion to (int32) logs3 */
    pdf = (float32 *) ckd_calloc(n_comp, sizeof(float32));

    /* Read senone probs data, normalize, floor, convert to logs3, truncate to 8 bits */
    n_err = 0;
    for (i = 0; i < n_sen; i++) {
        for (f = 0; f < n_feat; f++) {
            if (bio_fread((void *) pdf, sizeof(float32),
                          n_comp, fp, byteswap, &chksum) != n_comp) {
                E_FATAL("bio_fread(%s) (arraydata) failed\n", file_name);
            }

            /* Normalize and floor */
            if (vector_sum_norm(pdf, n_comp) <= 0.0)
                n_err++;
            vector_floor(pdf, n_comp, SmoothMin);
            vector_sum_norm(pdf, n_comp);

            /* Convert to LOG, quantize, and transpose */
            for (c = 0; c < n_comp; c++) {
                int32 qscr;

                qscr = -logmath_log(s->lmath_8b, pdf[c]);
                if ((qscr > MAX_NEG_MIXW) || (qscr < 0))
                    qscr = MAX_NEG_MIXW;
                s->mixw[f][c][i] = qscr;
            }
        }
    }
    if (n_err > 0)
        E_WARN("Weight normalization failed for %d mixture weights components\n", n_err);

    ckd_free(pdf);

    if (chksum_present)
        bio_verify_chksum(fp, byteswap, chksum);

    if (fread(&eofchk, 1, 1, fp) == 1)
        E_FATAL("More data than expected in %s\n", file_name);

    fclose(fp);

    E_INFO("Read %d x %d x %d mixture weights\n", n_sen, n_feat, n_comp);
    return n_sen;
}